

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int Symbol_insert(symbol *data,char *key)

{
  symbol *psVar1;
  symbol *psVar2;
  size_t __nmemb;
  s_x2 *psVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  s_x2node *psVar7;
  long lVar8;
  char *pcVar9;
  rule *prVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  s_x2node *__ptr;
  char *pcVar14;
  long lVar15;
  s_x2node *psVar16;
  
  psVar3 = x2a;
  if (x2a == (s_x2 *)0x0) {
LAB_0010c58e:
    iVar6 = 0;
  }
  else {
    cVar4 = *key;
    if (cVar4 == '\0') {
      uVar12 = 0;
    }
    else {
      pcVar9 = key + 1;
      uVar12 = 0;
      do {
        uVar12 = (int)cVar4 + uVar12 * 0xd;
        cVar4 = *pcVar9;
        pcVar9 = pcVar9 + 1;
      } while (cVar4 != '\0');
    }
    iVar6 = x2a->size;
    uVar11 = (ulong)(iVar6 - 1U & uVar12);
    psVar16 = (s_x2node *)x2a->ht;
    for (prVar10 = (rule *)(&psVar16->data)[uVar11]; prVar10 != (rule *)0x0;
        prVar10 = *(rule **)&prVar10->lhsStart) {
      iVar5 = strcmp(prVar10->lhsalias,key);
      if (iVar5 == 0) goto LAB_0010c58e;
    }
    iVar5 = psVar3->count;
    lVar15 = (long)iVar5;
    if (iVar5 < iVar6) {
      psVar7 = psVar3->tbl;
    }
    else {
      __nmemb = (long)iVar6 * 2;
      psVar7 = (s_x2node *)calloc(__nmemb,0x28);
      if (psVar7 == (s_x2node *)0x0) goto LAB_0010c58e;
      psVar16 = psVar7 + (long)iVar6 * 2;
      iVar6 = (int)__nmemb;
      if (iVar5 < 1) {
        __ptr = psVar3->tbl;
      }
      else {
        __ptr = psVar3->tbl;
        lVar8 = 0;
        do {
          pcVar9 = __ptr[lVar8].key;
          cVar4 = *pcVar9;
          uVar13 = 0;
          if (cVar4 != '\0') {
            uVar13 = 0;
            pcVar14 = pcVar9;
            do {
              pcVar14 = pcVar14 + 1;
              uVar13 = (int)cVar4 + uVar13 * 0xd;
              cVar4 = *pcVar14;
            } while (cVar4 != '\0');
          }
          psVar1 = (symbol *)(psVar7 + lVar8);
          psVar2 = (symbol *)(&psVar16->data + (uVar13 & iVar6 - 1U));
          if ((symbol *)psVar2->name == (symbol *)0x0) {
            prVar10 = (rule *)0x0;
          }
          else {
            ((symbol *)psVar2->name)->fallback = (symbol *)&psVar1->rule;
            prVar10 = (rule *)psVar2->name;
          }
          psVar1->rule = prVar10;
          *(char **)&psVar1->index = pcVar9;
          psVar1->name = (char *)__ptr[lVar8].data;
          psVar1->fallback = psVar2;
          psVar2->name = (char *)psVar1;
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar15);
      }
      free(__ptr);
      psVar3->size = iVar6;
      psVar3->tbl = psVar7;
      psVar3->ht = (s_x2node **)psVar16;
      uVar11 = (ulong)(iVar6 - 1U & uVar12);
    }
    psVar3->count = iVar5 + 1;
    psVar1 = (symbol *)(psVar7 + lVar15);
    psVar7[lVar15].key = key;
    psVar7[lVar15].data = data;
    if ((&psVar16->data)[uVar11] == (symbol *)0x0) {
      prVar10 = (rule *)0x0;
    }
    else {
      (&psVar16->data)[uVar11]->fallback = (symbol *)&psVar1->rule;
      prVar10 = (rule *)(&psVar16->data)[uVar11];
    }
    psVar1->rule = prVar10;
    (&psVar16->data)[uVar11] = psVar1;
    psVar1->fallback = (symbol *)(psVar3->ht + uVar11);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int Symbol_insert(struct symbol *data, const char *key)
{
  x2node *np;
  unsigned h;
  unsigned ph;

  if( x2a==0 ) return 0;
  ph = strhash(key);
  h = ph & (x2a->size-1);
  np = x2a->ht[h];
  while( np ){
    if( strcmp(np->key,key)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x2a->count>=x2a->size ){
    /* Need to make the hash table bigger */
    int i,arrSize;
    struct s_x2 array;
    array.size = arrSize = x2a->size*2;
    array.count = x2a->count;
    array.tbl = (x2node*)calloc(arrSize, sizeof(x2node) + sizeof(x2node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x2node**)&(array.tbl[arrSize]);
    for(i=0; i<arrSize; i++) array.ht[i] = 0;
    for(i=0; i<x2a->count; i++){
      x2node *oldnp, *newnp;
      oldnp = &(x2a->tbl[i]);
      h = strhash(oldnp->key) & (arrSize-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->key = oldnp->key;
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x2a->tbl);
    *x2a = array;
  }
  /* Insert the new data */
  h = ph & (x2a->size-1);
  np = &(x2a->tbl[x2a->count++]);
  np->key = key;
  np->data = data;
  if( x2a->ht[h] ) x2a->ht[h]->from = &(np->next);
  np->next = x2a->ht[h];
  x2a->ht[h] = np;
  np->from = &(x2a->ht[h]);
  return 1;
}